

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

xcb_generic_iterator_t xcb_input_input_state_end(xcb_input_input_state_iterator_t i)

{
  int iVar1;
  ulong uVar2;
  xcb_input_input_state_t *R;
  int iVar3;
  ulong uVar4;
  xcb_input_input_state_t *pxVar5;
  long in_FS_OFFSET;
  xcb_generic_iterator_t xVar6;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  int32_t *local_38;
  long local_30;
  
  uVar4 = i._8_8_;
  pxVar5 = i.data;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (i.rem < 1) {
    uVar2 = uVar4 >> 0x20;
  }
  else {
    iVar3 = i.rem + 1;
    uVar4 = 0;
    do {
      local_38 = (int32_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      iVar1 = xcb_input_input_state_data_unpack
                        (pxVar5 + 1,pxVar5->class_id,(xcb_input_input_state_data_t *)&local_88);
      uVar2 = (ulong)(iVar1 + 2);
      pxVar5 = (xcb_input_input_state_t *)(&pxVar5->class_id + uVar2);
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  xVar6._8_8_ = uVar4 & 0xffffffff | uVar2 << 0x20;
  xVar6.data = pxVar5;
  return xVar6;
}

Assistant:

xcb_generic_iterator_t
xcb_input_input_state_end (xcb_input_input_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_input_state_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}